

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* phosg::split_args(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *__return_storage_ptr__,string *s)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  runtime_error *prVar6;
  reference pvVar7;
  bool bVar8;
  bool is_space_between_args;
  char local_2a;
  char to_write;
  ulong uStack_28;
  bool can_be_space;
  size_t z;
  bool in_space_between_args;
  char current_quote;
  string *s_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  z._6_1_ = '\0';
  bVar2 = true;
  uStack_28 = 0;
  do {
    sVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (s);
    if (sVar4 <= uStack_28) {
      if (z._6_1_ != '\0') {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error(prVar6,"unterminated quoted string");
        __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      return __return_storage_ptr__;
    }
    bVar1 = true;
    local_2a = '\0';
    if (z._6_1_ == '\0') {
      pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](s,uStack_28);
      if ((*pvVar5 == '\"') ||
         (pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,uStack_28), *pvVar5 == '\'')) {
        pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s,uStack_28);
        z._6_1_ = *pvVar5;
      }
      else {
        pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s,uStack_28);
        if (*pvVar5 == '\\') {
          bVar1 = false;
          uStack_28 = uStack_28 + 1;
          sVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::size(s);
          if (sVar4 <= uStack_28) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar6,"incomplete escape sequence");
            __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,uStack_28);
          local_2a = *pvVar5;
        }
        else {
          pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,uStack_28);
          local_2a = *pvVar5;
        }
      }
    }
    else {
      bVar1 = false;
      pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](s,uStack_28);
      if (*pvVar5 == z._6_1_) {
        z._6_1_ = '\0';
      }
      else {
        pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](s,uStack_28);
        if (*pvVar5 == '\\') {
          uStack_28 = uStack_28 + 1;
          sVar4 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  ::size(s);
          if (sVar4 <= uStack_28) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar6,"incomplete escape sequence");
            __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,uStack_28);
          local_2a = *pvVar5;
        }
        else {
          pvVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                   ::operator[](s,uStack_28);
          local_2a = *pvVar5;
        }
      }
    }
    if (local_2a != '\0') {
      bVar8 = false;
      if (bVar1) {
        iVar3 = isblank((int)local_2a);
        bVar8 = iVar3 != 0;
      }
      if ((!bVar8) || (!bVar2)) {
        if ((bVar8) || (!bVar2)) {
          if ((!bVar8) || (bVar2)) {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)__return_storage_ptr__);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar7,
                      local_2a);
          }
          else {
            bVar2 = true;
          }
        }
        else {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(__return_storage_ptr__);
          if (local_2a != '\0') {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)__return_storage_ptr__);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar7,
                      local_2a);
          }
          bVar2 = false;
        }
      }
    }
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

vector<string> split_args(const string& s) {
  vector<string> ret;
  char current_quote = 0;
  bool in_space_between_args = true;

  for (size_t z = 0; z < s.size(); z++) {
    bool can_be_space = true;
    char to_write = 0;
    if (current_quote) {
      can_be_space = false;
      if (s[z] == current_quote) {
        current_quote = 0;
      } else if (s[z] == '\\') {
        z++;
        if (z >= s.size()) {
          throw runtime_error("incomplete escape sequence");
        }
        to_write = s[z];
      } else {
        to_write = s[z];
      }
    } else if ((s[z] == '\"') || (s[z] == '\'')) {
      current_quote = s[z];
    } else if (s[z] == '\\') {
      can_be_space = false;
      z++;
      if (z >= s.size()) {
        throw runtime_error("incomplete escape sequence");
      }
      to_write = s[z];
    } else {
      to_write = s[z];
    }

    if (to_write) {
      bool is_space_between_args = can_be_space && isblank(to_write);
      if (is_space_between_args && in_space_between_args) {
        // Nothing
      } else if (!is_space_between_args && in_space_between_args) {
        // Start of another arg
        ret.emplace_back();
        if (to_write) {
          ret.back().push_back(to_write);
        }
        in_space_between_args = false;
      } else if (is_space_between_args && !in_space_between_args) {
        in_space_between_args = true;
      } else { // !is_space_between_args && !in_space_between_args
        ret.back().push_back(to_write);
      }
    }
  }

  if (current_quote) {
    throw runtime_error("unterminated quoted string");
  }

  return ret;
}